

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,OrderedScreen *s)

{
  QTextStream *pQVar1;
  QPlatformScreen *pQVar2;
  QDebug QVar3;
  undefined8 *in_RDX;
  char *pcVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QDebugStateSaver saver;
  QArrayData *local_78;
  undefined8 *local_70;
  QPoint local_60;
  QDebug local_58;
  undefined1 *local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)s);
  pQVar1 = (QTextStream *)s->screen;
  pQVar1[0x30] = (QTextStream)0x0;
  QVar5.m_data = (storage_type *)0x1e;
  QVar5.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<(pQVar1,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (((QTextStream *)s->screen)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)s->screen,' ');
  }
  QTextStream::operator<<((QTextStream *)s->screen,(void *)*in_RDX);
  if (((QTextStream *)s->screen)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)s->screen,' ');
  }
  pQVar1 = (QTextStream *)s->screen;
  QVar6.m_data = (storage_type *)0x2;
  QVar6.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<(pQVar1,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (((QTextStream *)s->screen)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)s->screen,' ');
  }
  (**(code **)(*(long *)*in_RDX + 0x90))(&local_78);
  if (local_70 == (undefined8 *)0x0) {
    local_70 = &QString::_empty;
  }
  QDebug::putString((QChar *)s,(ulong)local_70);
  if (((QTextStream *)s->screen)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)s->screen,' ');
  }
  pQVar1 = (QTextStream *)s->screen;
  QVar7.m_data = (storage_type *)0x4;
  QVar7.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<(pQVar1,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (((QTextStream *)s->screen)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)s->screen,' ');
  }
  QTextStream::operator<<((QTextStream *)s->screen,*(int *)(in_RDX + 1));
  if (((QTextStream *)s->screen)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)s->screen,' ');
  }
  pQVar1 = (QTextStream *)s->screen;
  QVar8.m_data = (storage_type *)0x3;
  QVar8.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar1,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (((QTextStream *)s->screen)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)s->screen,' ');
  }
  local_60 = (QPoint)s->screen;
  *(int *)((long)local_60 + 0x28) = *(int *)((long)local_60 + 0x28) + 1;
  operator<<((Stream *)&local_58,&local_60);
  QVar3.stream = local_58.stream;
  QVar9.m_data = (storage_type *)0xc;
  QVar9.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<((QTextStream *)QVar3.stream,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_58.stream,' ');
  }
  pcVar4 = "false";
  if (*(char *)((long)in_RDX + 0x14) != '\0') {
    pcVar4 = "true";
  }
  QTextStream::operator<<((QTextStream *)local_58.stream,pcVar4);
  if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_58.stream,' ');
  }
  QVar3.stream = local_58.stream;
  QVar10.m_data = (storage_type *)0x1;
  QVar10.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar10);
  QTextStream::operator<<((QTextStream *)QVar3.stream,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_58.stream,' ');
  }
  QDebug::~QDebug(&local_58);
  QDebug::~QDebug((QDebug *)&local_60);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,2,0x10);
    }
  }
  pQVar2 = s->screen;
  s->screen = (QPlatformScreen *)0x0;
  *(QPlatformScreen **)dbg.stream = pQVar2;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const OrderedScreen &s)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "OrderedScreen(QPlatformScreen=" << s.screen << " (" << s.screen->name() << ") : "
                  << s.vinfo.virtualIndex
                  << " / " << s.vinfo.virtualPos
                  << " / primary: " << s.vinfo.isPrimary
                  << ")";
    return dbg;
}